

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_cover<false>(cb_explore *data,single_learner *base,example *ec)

{
  label *this;
  int iVar1;
  uint32_t uVar2;
  label_t lVar3;
  cb_class *pcVar4;
  size_t sVar5;
  wclass *pwVar6;
  wclass *pwVar7;
  uint32_t uVar8;
  action_scores probs;
  wclass local_68;
  v_array<ACTION_SCORE::action_score> local_58;
  
  uVar2 = (data->cbcs).num_actions;
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  this = &data->cs_label;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  if (uVar2 != 0) {
    uVar8 = 1;
    do {
      local_68.x = 3.4028235e+38;
      local_68.partial_prediction = 0.0;
      local_68.wap_value = 0.0;
      base = (single_learner *)&local_68;
      local_68.class_index = uVar8;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_68);
      iVar1 = (1 - uVar2) + uVar8;
      uVar8 = uVar8 + 1;
    } while (iVar1 != 1);
  }
  lVar3 = (ec->l).multi;
  pcVar4 = (cb_class *)(ec->l).cs.costs._end;
  sVar5 = (ec->l).cs.costs.erase_count;
  (data->cb_label).costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  (data->cb_label).costs.erase_count = sVar5;
  (data->cb_label).costs._begin = (cb_class *)lVar3;
  (data->cb_label).costs._end = pcVar4;
  pwVar6 = (data->cs_label).costs._end;
  pwVar7 = (data->cs_label).costs.end_array;
  sVar5 = (data->cs_label).costs.erase_count;
  (ec->l).multi = (label_t)(this->costs)._begin;
  (ec->l).cs.costs._end = pwVar6;
  (ec->l).cs.costs.end_array = pwVar7;
  (ec->l).cs.costs.erase_count = sVar5;
  get_cover_probabilities(data,base,ec,&local_58);
  lVar3 = (label_t)(data->cb_label).costs._begin;
  pcVar4 = (data->cb_label).costs._end;
  sVar5 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar5;
  (ec->l).multi = lVar3;
  (ec->l).cs.costs._end = (wclass *)pcVar4;
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = (float *)local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}